

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O2

void __thiscall bloaty::ObjectFile::set_debug_file(ObjectFile *this,ObjectFile *file)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*this->debug_file_->_vptr_ObjectFile[2])(&local_50);
  (*this->_vptr_ObjectFile[2])(&local_30,this);
  _Var1 = std::operator==(&local_50,&local_30);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    this->debug_file_ = file;
    return;
  }
  __assert_fail("debug_file_->GetBuildId() == GetBuildId()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.h",
                0x11a,"void bloaty::ObjectFile::set_debug_file(const ObjectFile *)");
}

Assistant:

void set_debug_file(const ObjectFile* file) {
    assert(debug_file_->GetBuildId() == GetBuildId());
    debug_file_ = file;
  }